

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

tetrahedron * __thiscall tetgenmesh::tetrahedrontraverse(tetgenmesh *this)

{
  tetrahedron *pppdVar1;
  
  do {
    pppdVar1 = (tetrahedron *)memorypool::traverse(this->tetrahedrons);
    if (pppdVar1 == (tetrahedron *)0x0) {
      return (tetrahedron *)0x0;
    }
  } while ((pppdVar1[4] == (tetrahedron)0x0) || (pppdVar1[7] == (tetrahedron)this->dummypoint));
  return pppdVar1;
}

Assistant:

tetgenmesh::tetrahedron* tetgenmesh::tetrahedrontraverse()
{
  tetrahedron *newtetrahedron;

  do {
    newtetrahedron = (tetrahedron *) tetrahedrons->traverse();
    if (newtetrahedron == (tetrahedron *) NULL) {
      return (tetrahedron *) NULL;
    }
  } while ((newtetrahedron[4] == (tetrahedron) NULL) ||
           ((point) newtetrahedron[7] == dummypoint));
  return newtetrahedron;
}